

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.h
# Opt level: O1

void __thiscall re2::Regexp::AllocSub(Regexp *this,int n)

{
  Regexp **ppRVar1;
  LogMessage LStack_198;
  
  if (0xffff < (uint)n) {
    LogMessage::LogMessage
              (&LStack_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.h",0x1ee
               ,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&LStack_198.str_,"Cannot AllocSub ",0x10);
    std::ostream::operator<<((ostream *)&LStack_198.str_,n);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_198);
  }
  if (1 < n) {
    ppRVar1 = (Regexp **)operator_new__((ulong)(uint)n << 3);
    (this->field_5).submany_ = ppRVar1;
  }
  this->nsub_ = (uint16)n;
  return;
}

Assistant:

void AllocSub(int n) {
    if (n < 0 || static_cast<uint16>(n) != n)
      LOG(FATAL) << "Cannot AllocSub " << n;
    if (n > 1)
      submany_ = new Regexp*[n];
    nsub_ = n;
  }